

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

Vec_Vec_t * Nwk_ManLevelize(Nwk_Man_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  void *Entry;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint nCapMin;
  ulong uVar8;
  
  iVar1 = Nwk_ManVerifyLevel(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Nwk_ManVerifyLevel(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                  ,0x112,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
  }
  uVar2 = Nwk_ManLevelMax(pNtk);
  nCapMin = uVar2 + 1;
  p = (Vec_Ptr_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar2) {
    uVar5 = nCapMin;
  }
  p->nCap = uVar5;
  uVar8 = 0;
  if (uVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)(int)uVar5 << 3);
  }
  p->pArray = ppvVar3;
  uVar6 = 0;
  if (0 < (int)nCapMin) {
    uVar6 = (ulong)nCapMin;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    pVVar4 = Vec_PtrAlloc(0);
    ppvVar3[uVar8] = pVVar4;
  }
  p->nSize = nCapMin;
  iVar1 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar1) {
      return (Vec_Vec_t *)p;
    }
    Entry = Vec_PtrEntry(pNtk->vObjs,iVar1);
    if ((Entry != (void *)0x0) && ((*(uint *)((long)Entry + 0x20) & 7) == 3)) {
      uVar5 = *(uint *)((long)Entry + 0x2c);
      if ((int)uVar2 < (int)uVar5) {
        __assert_fail("Nwk_ObjLevel(pObj) <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,0x117,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
      }
      if ((int)nCapMin <= (int)uVar5) {
        nCapMin = uVar5 + 1;
        Vec_PtrGrow(p,nCapMin);
        for (lVar7 = (long)p->nSize; lVar7 <= (int)uVar5; lVar7 = lVar7 + 1) {
          pVVar4 = Vec_PtrAlloc(0);
          p->pArray[lVar7] = pVVar4;
        }
        p->nSize = nCapMin;
      }
      if (((int)uVar5 < 0) || ((int)nCapMin <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      Vec_PtrPush((Vec_Ptr_t *)p->pArray[uVar5],Entry);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Nwk_ManLevelize( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    assert( Nwk_ManVerifyLevel(pNtk) );
    nLevels = Nwk_ManLevelMax( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        assert( Nwk_ObjLevel(pObj) <= nLevels );
        Vec_VecPush( vLevels, Nwk_ObjLevel(pObj), pObj );
    }
    return vLevels;
}